

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O2

boolean encode_mcu_gather(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  ushort uVar1;
  jpeg_entropy_encoder *pjVar2;
  JBLOCKROW paJVar3;
  _func_boolean_j_compress_ptr_JBLOCKROW_ptr *p_Var4;
  _func_void_j_compress_ptr *p_Var5;
  jpeg_error_mgr *pjVar6;
  ushort uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    uVar8 = *(uint *)&pjVar2[2].encode_mcu;
    if (uVar8 == 0) {
      for (lVar10 = 0; lVar10 < cinfo->comps_in_scan; lVar10 = lVar10 + 1) {
        *(undefined4 *)((long)&pjVar2[1].encode_mcu + lVar10 * 4 + 4) = 0;
      }
      uVar8 = cinfo->restart_interval;
    }
    *(uint *)&pjVar2[2].encode_mcu = uVar8 - 1;
  }
  for (lVar10 = 0; lVar10 < cinfo->blocks_in_MCU; lVar10 = lVar10 + 1) {
    lVar12 = (long)cinfo->MCU_membership[lVar10];
    paJVar3 = MCU_data[lVar10];
    p_Var4 = (&pjVar2[5].encode_mcu)[cinfo->cur_comp_info[lVar12]->dc_tbl_no];
    p_Var5 = (&pjVar2[6].finish_pass)[cinfo->cur_comp_info[lVar12]->ac_tbl_no];
    uVar11 = (int)(*paJVar3)[0] - *(int *)((long)&pjVar2[1].encode_mcu + lVar12 * 4 + 4);
    uVar8 = -uVar11;
    if (0 < (int)uVar11) {
      uVar8 = uVar11;
    }
    lVar14 = 0;
    for (; uVar8 != 0; uVar8 = uVar8 >> 1) {
      lVar14 = lVar14 + 1;
    }
    if (0xb < (uint)lVar14) {
      pjVar6 = cinfo->err;
      pjVar6->msg_code = 6;
      (*pjVar6->error_exit)((j_common_ptr)cinfo);
    }
    *(long *)(p_Var4 + lVar14 * 8) = *(long *)(p_Var4 + lVar14 * 8) + 1;
    iVar9 = 0;
    for (lVar14 = 1; lVar14 != 0x40; lVar14 = lVar14 + 1) {
      uVar1 = (*paJVar3)[jpeg_natural_order[lVar14]];
      if (uVar1 == 0) {
        iVar9 = iVar9 + 1;
      }
      else {
        iVar13 = iVar9 * 0x10 + 1;
        for (; 0xf < iVar9; iVar9 = iVar9 + -0x10) {
          *(long *)(p_Var5 + 0x780) = *(long *)(p_Var5 + 0x780) + 1;
          iVar13 = iVar13 + -0x100;
        }
        uVar7 = -uVar1;
        if (0 < (short)uVar1) {
          uVar7 = uVar1;
        }
        uVar11 = (uint)uVar7;
        uVar8 = 1;
        while( true ) {
          if (uVar11 < 2) break;
          uVar11 = uVar11 >> 1;
          uVar8 = uVar8 + 1;
          iVar13 = iVar13 + 1;
        }
        if (10 < uVar8) {
          pjVar6 = cinfo->err;
          pjVar6->msg_code = 6;
          (*pjVar6->error_exit)((j_common_ptr)cinfo);
        }
        *(long *)(p_Var5 + (long)iVar13 * 8) = *(long *)(p_Var5 + (long)iVar13 * 8) + 1;
        iVar9 = 0;
      }
    }
    if (0 < iVar9) {
      *(long *)p_Var5 = *(long *)p_Var5 + 1;
    }
    *(int *)((long)&pjVar2[1].encode_mcu + lVar12 * 4 + 4) = (int)(*MCU_data[lVar10])[0];
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_gather(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr)cinfo->entropy;
  int blkn, ci;
  jpeg_component_info *compptr;

  /* Take care of restart intervals if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      /* Re-initialize DC predictions to 0 */
      for (ci = 0; ci < cinfo->comps_in_scan; ci++)
        entropy->saved.last_dc_val[ci] = 0;
      /* Update restart state */
      entropy->restarts_to_go = cinfo->restart_interval;
    }
    entropy->restarts_to_go--;
  }

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];
    htest_one_block(cinfo, MCU_data[blkn][0], entropy->saved.last_dc_val[ci],
                    entropy->dc_count_ptrs[compptr->dc_tbl_no],
                    entropy->ac_count_ptrs[compptr->ac_tbl_no]);
    entropy->saved.last_dc_val[ci] = MCU_data[blkn][0][0];
  }

  return TRUE;
}